

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

void handle_filter_opt(char *_arg,int en)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  char *__ptr;
  char *__s1;
  ulong uVar28;
  int *piVar29;
  ulong uVar30;
  long lVar31;
  int *local_48;
  char *tokens;
  
  __ptr = strdup(_arg);
  local_48 = &obj_decoders[0].disabled;
  iVar3 = dump_decoded_ioctl_data;
  iVar4 = dump_tsc;
  iVar5 = dump_tic;
  iVar6 = dump_vp;
  iVar27 = dump_fp;
  iVar7 = dump_gp;
  iVar8 = dump_cp;
  iVar9 = dump_tep;
  iVar10 = dump_tcp;
  iVar11 = dump_buffer_usage;
  iVar12 = decode_pb;
  iVar13 = dump_sys_mmap;
  iVar14 = dump_sys_munmap;
  iVar15 = dump_sys_mremap;
  iVar16 = dump_sys_open;
  iVar17 = dump_msg;
  iVar18 = dump_sys_write;
  iVar19 = dump_object_tree_on_create_destroy;
  iVar20 = dump_memory_writes;
  iVar21 = dump_memory_reads;
  iVar22 = info;
  iVar23 = dump_raw_ioctl_data;
  iVar24 = dump_sys_mmap_details;
  iVar25 = print_gpu_addresses;
  tokens = __ptr;
LAB_002458a7:
  do {
    while( true ) {
      do {
        print_gpu_addresses = iVar25;
        dump_sys_mmap_details = iVar24;
        dump_raw_ioctl_data = iVar23;
        info = iVar22;
        dump_memory_reads = iVar21;
        dump_memory_writes = iVar20;
        dump_object_tree_on_create_destroy = iVar19;
        dump_sys_write = iVar18;
        dump_msg = iVar17;
        dump_sys_open = iVar16;
        dump_sys_mremap = iVar15;
        dump_sys_munmap = iVar14;
        dump_sys_mmap = iVar13;
        decode_pb = iVar12;
        dump_buffer_usage = iVar11;
        dump_tcp = iVar10;
        dump_tep = iVar9;
        dump_cp = iVar8;
        dump_gp = iVar7;
        dump_fp = iVar27;
        dump_vp = iVar6;
        dump_tic = iVar5;
        dump_tsc = iVar4;
        dump_decoded_ioctl_data = iVar3;
        if (tokens == (char *)0x0) {
          free(__ptr);
          return;
        }
        __s1 = strsep(&tokens,",");
        iVar26 = strcmp(__s1,"write");
        iVar3 = dump_decoded_ioctl_data;
        iVar4 = dump_tsc;
        iVar5 = dump_tic;
        iVar6 = dump_vp;
        iVar27 = dump_fp;
        iVar7 = dump_gp;
        iVar8 = dump_cp;
        iVar9 = dump_tep;
        iVar10 = dump_tcp;
        iVar11 = dump_buffer_usage;
        iVar12 = decode_pb;
        iVar13 = dump_sys_mmap;
        iVar14 = dump_sys_munmap;
        iVar15 = dump_sys_mremap;
        iVar16 = dump_sys_open;
        iVar17 = dump_msg;
        iVar18 = dump_sys_write;
        iVar19 = dump_object_tree_on_create_destroy;
        iVar20 = en;
        iVar21 = dump_memory_reads;
        iVar22 = info;
        iVar23 = dump_raw_ioctl_data;
        iVar24 = dump_sys_mmap_details;
        iVar25 = print_gpu_addresses;
      } while ((((iVar26 == 0) ||
                (iVar26 = strcmp(__s1,"read"), iVar3 = dump_decoded_ioctl_data, iVar4 = dump_tsc,
                iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp, iVar7 = dump_gp,
                iVar8 = dump_cp, iVar9 = dump_tep, iVar10 = dump_tcp, iVar11 = dump_buffer_usage,
                iVar12 = decode_pb, iVar13 = dump_sys_mmap, iVar14 = dump_sys_munmap,
                iVar15 = dump_sys_mremap, iVar16 = dump_sys_open, iVar17 = dump_msg,
                iVar18 = dump_sys_write, iVar19 = dump_object_tree_on_create_destroy,
                iVar20 = dump_memory_writes, iVar21 = en, iVar22 = info,
                iVar23 = dump_raw_ioctl_data, iVar24 = dump_sys_mmap_details,
                iVar25 = print_gpu_addresses, iVar26 == 0)) ||
               (iVar26 = strcmp(__s1,"gpu-addr"), iVar3 = dump_decoded_ioctl_data, iVar4 = dump_tsc,
               iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp, iVar7 = dump_gp, iVar8 = dump_cp
               , iVar9 = dump_tep, iVar10 = dump_tcp, iVar11 = dump_buffer_usage, iVar12 = decode_pb
               , iVar13 = dump_sys_mmap, iVar14 = dump_sys_munmap, iVar15 = dump_sys_mremap,
               iVar16 = dump_sys_open, iVar17 = dump_msg, iVar18 = dump_sys_write,
               iVar19 = dump_object_tree_on_create_destroy, iVar20 = dump_memory_writes,
               iVar21 = dump_memory_reads, iVar22 = info, iVar23 = dump_raw_ioctl_data,
               iVar24 = dump_sys_mmap_details, iVar25 = en, iVar26 == 0)) ||
              (((iVar26 = strcmp(__s1,"mem"), iVar3 = dump_decoded_ioctl_data, iVar4 = dump_tsc,
                iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp, iVar7 = dump_gp,
                iVar8 = dump_cp, iVar9 = dump_tep, iVar10 = dump_tcp, iVar11 = dump_buffer_usage,
                iVar12 = decode_pb, iVar13 = dump_sys_mmap, iVar14 = dump_sys_munmap,
                iVar15 = dump_sys_mremap, iVar16 = dump_sys_open, iVar17 = dump_msg,
                iVar18 = dump_sys_write, iVar19 = dump_object_tree_on_create_destroy, iVar20 = en,
                iVar21 = en, iVar22 = info, iVar23 = dump_raw_ioctl_data,
                iVar24 = dump_sys_mmap_details, iVar25 = print_gpu_addresses, iVar26 == 0 ||
                (iVar26 = strcmp(__s1,"ioctl-raw"), iVar3 = dump_decoded_ioctl_data,
                iVar4 = dump_tsc, iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp,
                iVar7 = dump_gp, iVar8 = dump_cp, iVar9 = dump_tep, iVar10 = dump_tcp,
                iVar11 = dump_buffer_usage, iVar12 = decode_pb, iVar13 = dump_sys_mmap,
                iVar14 = dump_sys_munmap, iVar15 = dump_sys_mremap, iVar16 = dump_sys_open,
                iVar17 = dump_msg, iVar18 = dump_sys_write,
                iVar19 = dump_object_tree_on_create_destroy, iVar20 = dump_memory_writes,
                iVar21 = dump_memory_reads, iVar22 = info, iVar23 = en,
                iVar24 = dump_sys_mmap_details, iVar25 = print_gpu_addresses, iVar26 == 0)) ||
               (iVar26 = strcmp(__s1,"ioctl-desc"), iVar3 = en, iVar4 = dump_tsc, iVar5 = dump_tic,
               iVar6 = dump_vp, iVar27 = dump_fp, iVar7 = dump_gp, iVar8 = dump_cp, iVar9 = dump_tep
               , iVar10 = dump_tcp, iVar11 = dump_buffer_usage, iVar12 = decode_pb,
               iVar13 = dump_sys_mmap, iVar14 = dump_sys_munmap, iVar15 = dump_sys_mremap,
               iVar16 = dump_sys_open, iVar17 = dump_msg, iVar18 = dump_sys_write,
               iVar19 = dump_object_tree_on_create_destroy, iVar20 = dump_memory_writes,
               iVar21 = dump_memory_reads, iVar22 = info, iVar23 = dump_raw_ioctl_data,
               iVar24 = dump_sys_mmap_details, iVar25 = print_gpu_addresses, iVar26 == 0))));
      iVar27 = strcmp(__s1,"ioctl");
      if (iVar27 != 0) break;
      iVar3 = en;
      iVar4 = dump_tsc;
      iVar5 = dump_tic;
      iVar6 = dump_vp;
      iVar27 = dump_fp;
      iVar7 = dump_gp;
      iVar8 = dump_cp;
      iVar9 = dump_tep;
      iVar10 = dump_tcp;
      iVar11 = dump_buffer_usage;
      iVar12 = decode_pb;
      iVar13 = dump_sys_mmap;
      iVar14 = dump_sys_munmap;
      iVar15 = dump_sys_mremap;
      iVar16 = dump_sys_open;
      iVar17 = dump_msg;
      iVar18 = dump_sys_write;
      iVar19 = en;
      iVar20 = dump_memory_writes;
      iVar21 = dump_memory_reads;
      iVar22 = info;
      iVar23 = dump_raw_ioctl_data;
      iVar24 = dump_sys_mmap_details;
      iVar25 = print_gpu_addresses;
      if (en == 0) {
        dump_raw_ioctl_data = 0;
        iVar3 = en;
        iVar19 = en;
        iVar23 = dump_raw_ioctl_data;
      }
    }
    iVar26 = strcmp(__s1,"tsc");
    iVar3 = dump_decoded_ioctl_data;
    iVar4 = en;
    iVar5 = dump_tic;
    iVar6 = dump_vp;
    iVar27 = dump_fp;
    iVar7 = dump_gp;
    iVar8 = dump_cp;
    iVar9 = dump_tep;
    iVar10 = dump_tcp;
    iVar11 = dump_buffer_usage;
    iVar12 = decode_pb;
    iVar13 = dump_sys_mmap;
    iVar14 = dump_sys_munmap;
    iVar15 = dump_sys_mremap;
    iVar16 = dump_sys_open;
    iVar17 = dump_msg;
    iVar18 = dump_sys_write;
    iVar19 = dump_object_tree_on_create_destroy;
    iVar20 = dump_memory_writes;
    iVar21 = dump_memory_reads;
    iVar22 = info;
    iVar23 = dump_raw_ioctl_data;
    iVar24 = dump_sys_mmap_details;
    iVar25 = print_gpu_addresses;
  } while ((iVar26 == 0) ||
          (iVar26 = strcmp(__s1,"tic"), iVar3 = dump_decoded_ioctl_data, iVar4 = dump_tsc,
          iVar5 = en, iVar6 = dump_vp, iVar27 = dump_fp, iVar7 = dump_gp, iVar8 = dump_cp,
          iVar9 = dump_tep, iVar10 = dump_tcp, iVar11 = dump_buffer_usage, iVar12 = decode_pb,
          iVar13 = dump_sys_mmap, iVar14 = dump_sys_munmap, iVar15 = dump_sys_mremap,
          iVar16 = dump_sys_open, iVar17 = dump_msg, iVar18 = dump_sys_write,
          iVar19 = dump_object_tree_on_create_destroy, iVar20 = dump_memory_writes,
          iVar21 = dump_memory_reads, iVar22 = info, iVar23 = dump_raw_ioctl_data,
          iVar24 = dump_sys_mmap_details, iVar25 = print_gpu_addresses, iVar26 == 0));
  cVar1 = *__s1;
  iVar5 = dump_tic;
  if (cVar1 == 'c') {
    if (__s1[1] == 'p') {
      cVar2 = __s1[2];
      iVar8 = en;
joined_r0x00245a36:
      if (cVar2 != '\0') goto LAB_00245a68;
      goto LAB_002458a7;
    }
  }
  else {
    if (cVar1 == 'f') {
      if (__s1[1] == 'p') {
        cVar2 = __s1[2];
        iVar27 = en;
        goto joined_r0x00245a36;
      }
      goto LAB_00245a68;
    }
    if (cVar1 == 'g') {
      if (__s1[1] == 'p') {
        cVar2 = __s1[2];
        iVar7 = en;
        goto joined_r0x00245a36;
      }
      goto LAB_00245a68;
    }
    if (((cVar1 == 'v') && (__s1[1] == 'p')) && (iVar6 = en, __s1[2] == '\0')) goto LAB_002458a7;
  }
LAB_00245a68:
  iVar26 = strcmp(__s1,"tep");
  iVar3 = dump_decoded_ioctl_data;
  iVar4 = dump_tsc;
  iVar5 = dump_tic;
  iVar6 = dump_vp;
  iVar27 = dump_fp;
  iVar7 = dump_gp;
  iVar8 = dump_cp;
  iVar9 = en;
  iVar10 = dump_tcp;
  iVar11 = dump_buffer_usage;
  iVar12 = decode_pb;
  iVar13 = dump_sys_mmap;
  iVar14 = dump_sys_munmap;
  iVar15 = dump_sys_mremap;
  iVar16 = dump_sys_open;
  iVar17 = dump_msg;
  iVar18 = dump_sys_write;
  iVar19 = dump_object_tree_on_create_destroy;
  iVar20 = dump_memory_writes;
  iVar21 = dump_memory_reads;
  iVar22 = info;
  iVar23 = dump_raw_ioctl_data;
  iVar24 = dump_sys_mmap_details;
  iVar25 = print_gpu_addresses;
  if (((iVar26 == 0) ||
      (iVar26 = strcmp(__s1,"tcp"), iVar3 = dump_decoded_ioctl_data, iVar4 = dump_tsc,
      iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp, iVar7 = dump_gp, iVar8 = dump_cp,
      iVar9 = dump_tep, iVar10 = en, iVar11 = dump_buffer_usage, iVar12 = decode_pb,
      iVar13 = dump_sys_mmap, iVar14 = dump_sys_munmap, iVar15 = dump_sys_mremap,
      iVar16 = dump_sys_open, iVar17 = dump_msg, iVar18 = dump_sys_write,
      iVar19 = dump_object_tree_on_create_destroy, iVar20 = dump_memory_writes,
      iVar21 = dump_memory_reads, iVar22 = info, iVar23 = dump_raw_ioctl_data,
      iVar24 = dump_sys_mmap_details, iVar25 = print_gpu_addresses, iVar26 == 0)) ||
     (iVar26 = strcmp(__s1,"shader"), iVar3 = dump_decoded_ioctl_data, iVar4 = dump_tsc,
     iVar5 = dump_tic, iVar6 = en, iVar27 = en, iVar7 = en, iVar8 = dump_cp, iVar9 = en, iVar10 = en
     , iVar11 = dump_buffer_usage, iVar12 = decode_pb, iVar13 = dump_sys_mmap,
     iVar14 = dump_sys_munmap, iVar15 = dump_sys_mremap, iVar16 = dump_sys_open, iVar17 = dump_msg,
     iVar18 = dump_sys_write, iVar19 = dump_object_tree_on_create_destroy,
     iVar20 = dump_memory_writes, iVar21 = dump_memory_reads, iVar22 = info,
     iVar23 = dump_raw_ioctl_data, iVar24 = dump_sys_mmap_details, iVar25 = print_gpu_addresses,
     iVar26 == 0)) goto LAB_002458a7;
  iVar27 = strcmp(__s1,"macro-rt-verbose");
  if (iVar27 == 0) {
    piVar29 = &macro_rt_verbose;
  }
  else {
    iVar27 = strcmp(__s1,"macro-rt");
    if (iVar27 == 0) {
      piVar29 = &macro_rt;
    }
    else {
      iVar27 = strcmp(__s1,"macro-dis");
      if (iVar27 != 0) {
        iVar27 = strcmp(__s1,"macro");
        if (iVar27 != 0) {
          iVar26 = strcmp(__s1,"buffer-usage");
          iVar3 = dump_decoded_ioctl_data;
          iVar4 = dump_tsc;
          iVar5 = dump_tic;
          iVar6 = dump_vp;
          iVar27 = dump_fp;
          iVar7 = dump_gp;
          iVar8 = dump_cp;
          iVar9 = dump_tep;
          iVar10 = dump_tcp;
          iVar11 = en;
          iVar12 = decode_pb;
          iVar13 = dump_sys_mmap;
          iVar14 = dump_sys_munmap;
          iVar15 = dump_sys_mremap;
          iVar16 = dump_sys_open;
          iVar17 = dump_msg;
          iVar18 = dump_sys_write;
          iVar19 = dump_object_tree_on_create_destroy;
          iVar20 = dump_memory_writes;
          iVar21 = dump_memory_reads;
          iVar22 = info;
          iVar23 = dump_raw_ioctl_data;
          iVar24 = dump_sys_mmap_details;
          iVar25 = print_gpu_addresses;
          if (iVar26 == 0) goto LAB_002458a7;
          iVar27 = strncmp(__s1,"class=",6);
          if (iVar27 == 0) {
            iVar27 = strcmp(__s1 + 6,"all");
            if (iVar27 == 0) {
              _filter_all_classes(en);
              iVar3 = dump_decoded_ioctl_data;
              iVar4 = dump_tsc;
              iVar5 = dump_tic;
              iVar6 = dump_vp;
              iVar27 = dump_fp;
              iVar7 = dump_gp;
              iVar8 = dump_cp;
              iVar9 = dump_tep;
              iVar10 = dump_tcp;
              iVar11 = dump_buffer_usage;
              iVar12 = decode_pb;
              iVar13 = dump_sys_mmap;
              iVar14 = dump_sys_munmap;
              iVar15 = dump_sys_mremap;
              iVar16 = dump_sys_open;
              iVar17 = dump_msg;
              iVar18 = dump_sys_write;
              iVar19 = dump_object_tree_on_create_destroy;
              iVar20 = dump_memory_writes;
              iVar21 = dump_memory_reads;
              iVar22 = info;
              iVar23 = dump_raw_ioctl_data;
              iVar24 = dump_sys_mmap_details;
              iVar25 = print_gpu_addresses;
            }
            else {
              uVar28 = strtoul(__s1 + 6,(char **)0x0,0x10);
              for (piVar29 = local_48; iVar3 = dump_decoded_ioctl_data, iVar4 = dump_tsc,
                  iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp, iVar7 = dump_gp,
                  iVar8 = dump_cp, iVar9 = dump_tep, iVar10 = dump_tcp, iVar11 = dump_buffer_usage,
                  iVar12 = decode_pb, iVar13 = dump_sys_mmap, iVar14 = dump_sys_munmap,
                  iVar15 = dump_sys_mremap, iVar16 = dump_sys_open, iVar17 = dump_msg,
                  iVar18 = dump_sys_write, iVar19 = dump_object_tree_on_create_destroy,
                  iVar20 = dump_memory_writes, iVar21 = dump_memory_reads, iVar22 = info,
                  iVar23 = dump_raw_ioctl_data, iVar24 = dump_sys_mmap_details,
                  iVar25 = print_gpu_addresses, ((gpu_object_decoder *)(piVar29 + -8))->class_ != 0;
                  piVar29 = piVar29 + 10) {
                if (((gpu_object_decoder *)(piVar29 + -8))->class_ == (uint32_t)uVar28) {
                  *piVar29 = (uint)(en == 0);
                  iVar3 = dump_decoded_ioctl_data;
                  iVar4 = dump_tsc;
                  iVar5 = dump_tic;
                  iVar6 = dump_vp;
                  iVar27 = dump_fp;
                  iVar7 = dump_gp;
                  iVar8 = dump_cp;
                  iVar9 = dump_tep;
                  iVar10 = dump_tcp;
                  iVar11 = dump_buffer_usage;
                  iVar12 = decode_pb;
                  iVar13 = dump_sys_mmap;
                  iVar14 = dump_sys_munmap;
                  iVar15 = dump_sys_mremap;
                  iVar16 = dump_sys_open;
                  iVar17 = dump_msg;
                  iVar18 = dump_sys_write;
                  iVar19 = dump_object_tree_on_create_destroy;
                  iVar20 = dump_memory_writes;
                  iVar21 = dump_memory_reads;
                  iVar22 = info;
                  iVar23 = dump_raw_ioctl_data;
                  iVar24 = dump_sys_mmap_details;
                  iVar25 = print_gpu_addresses;
                  break;
                }
              }
            }
            goto LAB_002458a7;
          }
          if ((((cVar1 == 'p') && (__s1[1] == 'b')) &&
              (iVar3 = dump_decoded_ioctl_data, iVar4 = dump_tsc, iVar5 = dump_tic, iVar6 = dump_vp,
              iVar27 = dump_fp, iVar7 = dump_gp, iVar8 = dump_cp, iVar9 = dump_tep,
              iVar10 = dump_tcp, iVar11 = dump_buffer_usage, iVar12 = en, iVar13 = dump_sys_mmap,
              iVar14 = dump_sys_munmap, iVar15 = dump_sys_mremap, iVar16 = dump_sys_open,
              iVar17 = dump_msg, iVar18 = dump_sys_write,
              iVar19 = dump_object_tree_on_create_destroy, iVar20 = dump_memory_writes,
              iVar21 = dump_memory_reads, iVar22 = info, iVar23 = dump_raw_ioctl_data,
              iVar24 = dump_sys_mmap_details, iVar25 = print_gpu_addresses, __s1[2] == '\0')) ||
             (((((iVar26 = strcmp(__s1,"sys_mmap"), iVar3 = dump_decoded_ioctl_data,
                 iVar4 = dump_tsc, iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp,
                 iVar7 = dump_gp, iVar8 = dump_cp, iVar9 = dump_tep, iVar10 = dump_tcp,
                 iVar11 = dump_buffer_usage, iVar12 = decode_pb, iVar13 = en,
                 iVar14 = dump_sys_munmap, iVar15 = dump_sys_mremap, iVar16 = dump_sys_open,
                 iVar17 = dump_msg, iVar18 = dump_sys_write,
                 iVar19 = dump_object_tree_on_create_destroy, iVar20 = dump_memory_writes,
                 iVar21 = dump_memory_reads, iVar22 = info, iVar23 = dump_raw_ioctl_data,
                 iVar24 = dump_sys_mmap_details, iVar25 = print_gpu_addresses, iVar26 == 0 ||
                 (iVar26 = strcmp(__s1,"sys_mmap_details"), iVar3 = dump_decoded_ioctl_data,
                 iVar4 = dump_tsc, iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp,
                 iVar7 = dump_gp, iVar8 = dump_cp, iVar9 = dump_tep, iVar10 = dump_tcp,
                 iVar11 = dump_buffer_usage, iVar12 = decode_pb, iVar13 = dump_sys_mmap,
                 iVar14 = dump_sys_munmap, iVar15 = dump_sys_mremap, iVar16 = dump_sys_open,
                 iVar17 = dump_msg, iVar18 = dump_sys_write,
                 iVar19 = dump_object_tree_on_create_destroy, iVar20 = dump_memory_writes,
                 iVar21 = dump_memory_reads, iVar22 = info, iVar23 = dump_raw_ioctl_data,
                 iVar24 = en, iVar25 = print_gpu_addresses, iVar26 == 0)) ||
                (iVar26 = strcmp(__s1,"sys_munmap"), iVar3 = dump_decoded_ioctl_data,
                iVar4 = dump_tsc, iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp,
                iVar7 = dump_gp, iVar8 = dump_cp, iVar9 = dump_tep, iVar10 = dump_tcp,
                iVar11 = dump_buffer_usage, iVar12 = decode_pb, iVar13 = dump_sys_mmap, iVar14 = en,
                iVar15 = dump_sys_mremap, iVar16 = dump_sys_open, iVar17 = dump_msg,
                iVar18 = dump_sys_write, iVar19 = dump_object_tree_on_create_destroy,
                iVar20 = dump_memory_writes, iVar21 = dump_memory_reads, iVar22 = info,
                iVar23 = dump_raw_ioctl_data, iVar24 = dump_sys_mmap_details,
                iVar25 = print_gpu_addresses, iVar26 == 0)) ||
               ((iVar26 = strcmp(__s1,"sys_mremap"), iVar3 = dump_decoded_ioctl_data,
                iVar4 = dump_tsc, iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp,
                iVar7 = dump_gp, iVar8 = dump_cp, iVar9 = dump_tep, iVar10 = dump_tcp,
                iVar11 = dump_buffer_usage, iVar12 = decode_pb, iVar13 = dump_sys_mmap,
                iVar14 = dump_sys_munmap, iVar15 = en, iVar16 = dump_sys_open, iVar17 = dump_msg,
                iVar18 = dump_sys_write, iVar19 = dump_object_tree_on_create_destroy,
                iVar20 = dump_memory_writes, iVar21 = dump_memory_reads, iVar22 = info,
                iVar23 = dump_raw_ioctl_data, iVar24 = dump_sys_mmap_details,
                iVar25 = print_gpu_addresses, iVar26 == 0 ||
                (iVar26 = strcmp(__s1,"sys_open"), iVar3 = dump_decoded_ioctl_data, iVar4 = dump_tsc
                , iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp, iVar7 = dump_gp,
                iVar8 = dump_cp, iVar9 = dump_tep, iVar10 = dump_tcp, iVar11 = dump_buffer_usage,
                iVar12 = decode_pb, iVar13 = dump_sys_mmap, iVar14 = dump_sys_munmap,
                iVar15 = dump_sys_mremap, iVar16 = en, iVar17 = dump_msg, iVar18 = dump_sys_write,
                iVar19 = dump_object_tree_on_create_destroy, iVar20 = dump_memory_writes,
                iVar21 = dump_memory_reads, iVar22 = info, iVar23 = dump_raw_ioctl_data,
                iVar24 = dump_sys_mmap_details, iVar25 = print_gpu_addresses, iVar26 == 0)))) ||
              ((iVar26 = strcmp(__s1,"msg"), iVar3 = dump_decoded_ioctl_data, iVar4 = dump_tsc,
               iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp, iVar7 = dump_gp, iVar8 = dump_cp
               , iVar9 = dump_tep, iVar10 = dump_tcp, iVar11 = dump_buffer_usage, iVar12 = decode_pb
               , iVar13 = dump_sys_mmap, iVar14 = dump_sys_munmap, iVar15 = dump_sys_mremap,
               iVar16 = dump_sys_open, iVar17 = en, iVar18 = dump_sys_write,
               iVar19 = dump_object_tree_on_create_destroy, iVar20 = dump_memory_writes,
               iVar21 = dump_memory_reads, iVar22 = info, iVar23 = dump_raw_ioctl_data,
               iVar24 = dump_sys_mmap_details, iVar25 = print_gpu_addresses, iVar26 == 0 ||
               (iVar26 = strcmp(__s1,"sys_write"), iVar3 = dump_decoded_ioctl_data, iVar4 = dump_tsc
               , iVar5 = dump_tic, iVar6 = dump_vp, iVar27 = dump_fp, iVar7 = dump_gp,
               iVar8 = dump_cp, iVar9 = dump_tep, iVar10 = dump_tcp, iVar11 = dump_buffer_usage,
               iVar12 = decode_pb, iVar13 = dump_sys_mmap, iVar14 = dump_sys_munmap,
               iVar15 = dump_sys_mremap, iVar16 = dump_sys_open, iVar17 = dump_msg, iVar18 = en,
               iVar19 = dump_object_tree_on_create_destroy, iVar20 = dump_memory_writes,
               iVar21 = dump_memory_reads, iVar22 = info, iVar23 = dump_raw_ioctl_data,
               iVar24 = dump_sys_mmap_details, iVar25 = print_gpu_addresses, iVar26 == 0))))))
          goto LAB_002458a7;
          iVar27 = strcmp(__s1,"sys");
          if (iVar27 == 0) {
            iVar3 = en;
            iVar4 = dump_tsc;
            iVar5 = dump_tic;
            iVar6 = dump_vp;
            iVar27 = dump_fp;
            iVar7 = dump_gp;
            iVar8 = dump_cp;
            iVar9 = dump_tep;
            iVar10 = dump_tcp;
            iVar11 = dump_buffer_usage;
            iVar12 = decode_pb;
            iVar13 = en;
            iVar14 = en;
            iVar15 = en;
            iVar16 = en;
            iVar17 = dump_msg;
            iVar18 = en;
            iVar19 = en;
            iVar20 = dump_memory_writes;
            iVar21 = dump_memory_reads;
            iVar22 = info;
            iVar23 = dump_raw_ioctl_data;
            iVar24 = dump_sys_mmap_details;
            iVar25 = print_gpu_addresses;
            if (en == 0) {
              dump_sys_mmap_details = 0;
              dump_raw_ioctl_data = 0;
              iVar3 = en;
              iVar13 = en;
              iVar14 = en;
              iVar15 = en;
              iVar16 = en;
              iVar18 = en;
              iVar19 = en;
              iVar23 = dump_raw_ioctl_data;
              iVar24 = dump_sys_mmap_details;
            }
            goto LAB_002458a7;
          }
          iVar27 = strcmp(__s1,"nvrm-handle-desc");
          if (iVar27 == 0) {
            piVar29 = &nvrm_describe_handles;
          }
          else {
            iVar27 = strcmp(__s1,"nvrm-class-desc");
            if (iVar27 != 0) {
              iVar27 = strncmp(__s1,"nvrm-mthd=",10);
              if (iVar27 == 0) {
                iVar27 = strcmp(__s1 + 10,"all");
                if (iVar27 == 0) {
                  _filter_all_nvrm_mthds(en);
                }
                else {
                  uVar28 = strtoul(__s1 + 10,(char **)0x0,0x10);
                  uVar30 = (ulong)(uint)nvrm_mthds_cnt;
                  if (nvrm_mthds_cnt < 1) {
                    uVar30 = 0;
                  }
                  for (lVar31 = 0; uVar30 * 0x30 - lVar31 != 0; lVar31 = lVar31 + 0x30) {
                    if (*(int *)((long)&nvrm_mthds[0].mthd + lVar31) == (int)uVar28) {
                      *(uint *)((long)&nvrm_mthds[0].disabled + lVar31) = (uint)(en == 0);
                    }
                  }
                }
                iVar3 = dump_decoded_ioctl_data;
                iVar4 = dump_tsc;
                iVar5 = dump_tic;
                iVar6 = dump_vp;
                iVar27 = dump_fp;
                iVar7 = dump_gp;
                iVar8 = dump_cp;
                iVar9 = dump_tep;
                iVar10 = dump_tcp;
                iVar11 = dump_buffer_usage;
                iVar12 = decode_pb;
                iVar13 = dump_sys_mmap;
                iVar14 = dump_sys_munmap;
                iVar15 = dump_sys_mremap;
                iVar16 = dump_sys_open;
                iVar17 = dump_msg;
                iVar18 = dump_sys_write;
                iVar19 = dump_object_tree_on_create_destroy;
                iVar20 = dump_memory_writes;
                iVar21 = dump_memory_reads;
                iVar22 = info;
                iVar23 = dump_raw_ioctl_data;
                iVar24 = dump_sys_mmap_details;
                iVar25 = print_gpu_addresses;
                if (en == 0) goto LAB_002458a7;
                _filter_nvrm_ioctl("call",1);
              }
              else {
                iVar27 = strcmp(__s1,"nvrm-unk-0-fields");
                if (iVar27 == 0) {
                  piVar29 = &nvrm_show_unk_zero_fields;
                  goto LAB_00245e27;
                }
                iVar27 = strncmp(__s1,"nvrm-ioctl=",0xb);
                if (iVar27 != 0) {
                  iVar26 = strcmp(__s1,"nvrm-obj-tree");
                  iVar3 = dump_decoded_ioctl_data;
                  iVar4 = dump_tsc;
                  iVar5 = dump_tic;
                  iVar6 = dump_vp;
                  iVar27 = dump_fp;
                  iVar7 = dump_gp;
                  iVar8 = dump_cp;
                  iVar9 = dump_tep;
                  iVar10 = dump_tcp;
                  iVar11 = dump_buffer_usage;
                  iVar12 = decode_pb;
                  iVar13 = dump_sys_mmap;
                  iVar14 = dump_sys_munmap;
                  iVar15 = dump_sys_mremap;
                  iVar16 = dump_sys_open;
                  iVar17 = dump_msg;
                  iVar18 = dump_sys_write;
                  iVar19 = en;
                  iVar20 = dump_memory_writes;
                  iVar21 = dump_memory_reads;
                  iVar22 = info;
                  iVar23 = dump_raw_ioctl_data;
                  iVar24 = dump_sys_mmap_details;
                  iVar25 = print_gpu_addresses;
                  if (iVar26 != 0) {
                    iVar27 = strcmp(__s1,"nvrm");
                    if (iVar27 == 0) {
                      if (en != 0) {
                        dump_decoded_ioctl_data = 1;
                      }
                      _filter_all_nvrm_ioctls(en);
                      _filter_all_nvrm_mthds(en);
                      iVar3 = dump_decoded_ioctl_data;
                      iVar4 = dump_tsc;
                      iVar5 = dump_tic;
                      iVar6 = dump_vp;
                      iVar27 = dump_fp;
                      iVar7 = dump_gp;
                      iVar8 = dump_cp;
                      iVar9 = dump_tep;
                      iVar10 = dump_tcp;
                      iVar11 = dump_buffer_usage;
                      iVar12 = decode_pb;
                      iVar13 = dump_sys_mmap;
                      iVar14 = dump_sys_munmap;
                      iVar15 = dump_sys_mremap;
                      iVar16 = dump_sys_open;
                      iVar17 = dump_msg;
                      iVar18 = dump_sys_write;
                      iVar19 = en;
                      iVar20 = dump_memory_writes;
                      iVar21 = dump_memory_reads;
                      iVar22 = info;
                      nvrm_describe_classes = en;
                      nvrm_describe_handles = en;
                      iVar23 = dump_raw_ioctl_data;
                      iVar24 = dump_sys_mmap_details;
                      iVar25 = print_gpu_addresses;
                    }
                    else {
                      iVar26 = strcmp(__s1,"info");
                      iVar3 = dump_decoded_ioctl_data;
                      iVar4 = dump_tsc;
                      iVar5 = dump_tic;
                      iVar6 = dump_vp;
                      iVar27 = dump_fp;
                      iVar7 = dump_gp;
                      iVar8 = dump_cp;
                      iVar9 = dump_tep;
                      iVar10 = dump_tcp;
                      iVar11 = dump_buffer_usage;
                      iVar12 = decode_pb;
                      iVar13 = dump_sys_mmap;
                      iVar14 = dump_sys_munmap;
                      iVar15 = dump_sys_mremap;
                      iVar16 = dump_sys_open;
                      iVar17 = dump_msg;
                      iVar18 = dump_sys_write;
                      iVar19 = dump_object_tree_on_create_destroy;
                      iVar20 = dump_memory_writes;
                      iVar21 = dump_memory_reads;
                      iVar22 = en;
                      iVar23 = dump_raw_ioctl_data;
                      iVar24 = dump_sys_mmap_details;
                      iVar25 = print_gpu_addresses;
                      if (iVar26 != 0) {
                        iVar27 = strcmp(__s1,"all");
                        if (iVar27 != 0) {
                          fprintf(_stderr,"unknown token: %s\n",__s1);
                          fflush(_stderr);
                          exit(1);
                        }
                        dump_decoded_ioctl_data = en;
                        dump_tsc = en;
                        dump_tic = en;
                        dump_vp = en;
                        dump_fp = en;
                        dump_gp = en;
                        dump_cp = en;
                        dump_tep = en;
                        dump_tcp = en;
                        dump_buffer_usage = en;
                        dump_memory_writes = en;
                        dump_memory_reads = en;
                        info = en;
                        macro_rt = en;
                        macro_dis_enabled = en;
                        dump_raw_ioctl_data = en;
                        print_gpu_addresses = en;
                        macro_rt_verbose = en;
                        _filter_all_classes(en);
                        decode_pb = en;
                        dump_sys_mmap = en;
                        dump_sys_munmap = en;
                        dump_sys_mremap = en;
                        dump_sys_open = en;
                        dump_msg = en;
                        dump_sys_write = en;
                        nvrm_describe_classes = en;
                        nvrm_describe_handles = en;
                        dump_sys_mmap_details = en;
                        _filter_all_nvrm_mthds(en);
                        nvrm_show_unk_zero_fields = en;
                        _filter_all_nvrm_ioctls(en);
                        iVar3 = dump_decoded_ioctl_data;
                        iVar4 = dump_tsc;
                        iVar5 = dump_tic;
                        iVar6 = dump_vp;
                        iVar27 = dump_fp;
                        iVar7 = dump_gp;
                        iVar8 = dump_cp;
                        iVar9 = dump_tep;
                        iVar10 = dump_tcp;
                        iVar11 = dump_buffer_usage;
                        iVar12 = decode_pb;
                        iVar13 = dump_sys_mmap;
                        iVar14 = dump_sys_munmap;
                        iVar15 = dump_sys_mremap;
                        iVar16 = dump_sys_open;
                        iVar17 = dump_msg;
                        iVar18 = dump_sys_write;
                        iVar19 = en;
                        iVar20 = dump_memory_writes;
                        iVar21 = dump_memory_reads;
                        iVar22 = info;
                        iVar23 = dump_raw_ioctl_data;
                        iVar24 = dump_sys_mmap_details;
                        iVar25 = print_gpu_addresses;
                      }
                    }
                  }
                  goto LAB_002458a7;
                }
                iVar27 = strcmp(__s1 + 0xb,"all");
                if (iVar27 == 0) {
                  _filter_all_nvrm_ioctls(en);
                }
                else {
                  _filter_nvrm_ioctl(__s1 + 0xb,en);
                }
                iVar3 = dump_decoded_ioctl_data;
                iVar4 = dump_tsc;
                iVar5 = dump_tic;
                iVar6 = dump_vp;
                iVar27 = dump_fp;
                iVar7 = dump_gp;
                iVar8 = dump_cp;
                iVar9 = dump_tep;
                iVar10 = dump_tcp;
                iVar11 = dump_buffer_usage;
                iVar12 = decode_pb;
                iVar13 = dump_sys_mmap;
                iVar14 = dump_sys_munmap;
                iVar15 = dump_sys_mremap;
                iVar16 = dump_sys_open;
                iVar17 = dump_msg;
                iVar18 = dump_sys_write;
                iVar19 = dump_object_tree_on_create_destroy;
                iVar20 = dump_memory_writes;
                iVar21 = dump_memory_reads;
                iVar22 = info;
                iVar23 = dump_raw_ioctl_data;
                iVar24 = dump_sys_mmap_details;
                iVar25 = print_gpu_addresses;
                if (en == 0) goto LAB_002458a7;
              }
              dump_decoded_ioctl_data = 1;
              iVar3 = dump_decoded_ioctl_data;
              iVar4 = dump_tsc;
              iVar5 = dump_tic;
              iVar6 = dump_vp;
              iVar27 = dump_fp;
              iVar7 = dump_gp;
              iVar8 = dump_cp;
              iVar9 = dump_tep;
              iVar10 = dump_tcp;
              iVar11 = dump_buffer_usage;
              iVar12 = decode_pb;
              iVar13 = dump_sys_mmap;
              iVar14 = dump_sys_munmap;
              iVar15 = dump_sys_mremap;
              iVar16 = dump_sys_open;
              iVar17 = dump_msg;
              iVar18 = dump_sys_write;
              iVar19 = dump_object_tree_on_create_destroy;
              iVar20 = dump_memory_writes;
              iVar21 = dump_memory_reads;
              iVar22 = info;
              iVar23 = dump_raw_ioctl_data;
              iVar24 = dump_sys_mmap_details;
              iVar25 = print_gpu_addresses;
              goto LAB_002458a7;
            }
            piVar29 = &nvrm_describe_classes;
          }
          goto LAB_00245e27;
        }
        macro_rt = en;
        if (en == 0) {
          macro_rt_verbose = 0;
        }
      }
      piVar29 = &macro_dis_enabled;
    }
  }
LAB_00245e27:
  *piVar29 = en;
  iVar3 = dump_decoded_ioctl_data;
  iVar4 = dump_tsc;
  iVar5 = dump_tic;
  iVar6 = dump_vp;
  iVar27 = dump_fp;
  iVar7 = dump_gp;
  iVar8 = dump_cp;
  iVar9 = dump_tep;
  iVar10 = dump_tcp;
  iVar11 = dump_buffer_usage;
  iVar12 = decode_pb;
  iVar13 = dump_sys_mmap;
  iVar14 = dump_sys_munmap;
  iVar15 = dump_sys_mremap;
  iVar16 = dump_sys_open;
  iVar17 = dump_msg;
  iVar18 = dump_sys_write;
  iVar19 = dump_object_tree_on_create_destroy;
  iVar20 = dump_memory_writes;
  iVar21 = dump_memory_reads;
  iVar22 = info;
  iVar23 = dump_raw_ioctl_data;
  iVar24 = dump_sys_mmap_details;
  iVar25 = print_gpu_addresses;
  goto LAB_002458a7;
}

Assistant:

static void handle_filter_opt(const char *_arg, int en)
{
	char *arg = strdup(_arg);
	char *tokens = arg;

	while (tokens)
	{
		char *token = strsep(&tokens, ",");
		if (strcmp(token, "write") == 0)
			_filter_write(en);
		else if (strcmp(token, "read") == 0)
			_filter_read(en);
		else if (strcmp(token, "gpu-addr") == 0)
			_filter_gpu_addr(en);
		else if (strcmp(token, "mem") == 0)
		{
			_filter_write(en);
			_filter_read(en);
		}
		else if (strcmp(token, "ioctl-raw") == 0)
			_filter_ioctl_raw(en);
		else if (strcmp(token, "ioctl-desc") == 0)
			_filter_ioctl_desc(en);
		else if (strcmp(token, "ioctl") == 0)
		{
			if (!en)
				_filter_ioctl_raw(en);
			_filter_ioctl_desc(en);
			_filter_dump_object_tree_on_create_destroy(en);
		}
		else if (strcmp(token, "tsc") == 0)
			_filter_tsc(en);
		else if (strcmp(token, "tic") == 0)
			_filter_tic(en);
		else if (strcmp(token, "vp") == 0)
			_filter_vp(en);
		else if (strcmp(token, "fp") == 0)
			_filter_fp(en);
		else if (strcmp(token, "gp") == 0)
			_filter_gp(en);
		else if (strcmp(token, "cp") == 0)
			_filter_cp(en);
		else if (strcmp(token, "tep") == 0)
			_filter_tep(en);
		else if (strcmp(token, "tcp") == 0)
			_filter_tcp(en);
		else if (strcmp(token, "shader") == 0)
		{
			_filter_vp(en);
			_filter_fp(en);
			_filter_gp(en);
			_filter_tcp(en);
			_filter_tep(en);
		}
		else if (strcmp(token, "macro-rt-verbose") == 0)
			_filter_macro_rt_verbose(en);
		else if (strcmp(token, "macro-rt") == 0)
			_filter_macro_rt(en);
		else if (strcmp(token, "macro-dis") == 0)
			_filter_macro_dis_enabled(en);
		else if (strcmp(token, "macro") == 0)
		{
			if (!en)
				_filter_macro_rt_verbose(en);
			_filter_macro_rt(en);
			_filter_macro_dis_enabled(en);
		}
		else if (strcmp(token, "buffer-usage") == 0)
			_filter_buffer_usage(en);
		else if (strncmp(token, "class=", 6) == 0)
		{
			if (strcmp(token + 6, "all") == 0)
				_filter_all_classes(en);
			else
				_filter_class(token + 6, en);
		}
		else if (strcmp(token, "pb") == 0)
			_filter_decode_pb(en);
		else if (strcmp(token, "sys_mmap") == 0)
			_filter_sys_mmap(en);
		else if (strcmp(token, "sys_mmap_details") == 0)
			_filter_sys_mmap_details(en);
		else if (strcmp(token, "sys_munmap") == 0)
			_filter_sys_munmap(en);
		else if (strcmp(token, "sys_mremap") == 0)
			_filter_sys_mremap(en);
		else if (strcmp(token, "sys_open") == 0)
			_filter_sys_open(en);
		else if (strcmp(token, "msg") == 0)
			_filter_msg(en);
		else if (strcmp(token, "sys_write") == 0)
			_filter_sys_write(en);
		else if (strcmp(token, "sys") == 0)
		{
			_filter_sys_mmap(en);
			if (!en)
				_filter_sys_mmap_details(en);
			_filter_sys_munmap(en);
			_filter_sys_mremap(en);
			_filter_sys_open(en);
			_filter_sys_write(en);

			if (!en)
				_filter_ioctl_raw(en);
			_filter_ioctl_desc(en);
			_filter_dump_object_tree_on_create_destroy(en);
		}
		else if (strcmp(token, "nvrm-handle-desc") == 0)
			_filter_nvrm_describe_handles(en);
		else if (strcmp(token, "nvrm-class-desc") == 0)
			_filter_nvrm_describe_classes(en);
		else if (strncmp(token, "nvrm-mthd=", 10) == 0)
		{
			if (strcmp(token + 10, "all") == 0)
				_filter_all_nvrm_mthds(en);
			else
				_filter_nvrm_mthd(token + 10, en);
			if (en)
			{
				_filter_nvrm_ioctl("call", en);
				_filter_ioctl_desc(en);
			}
		}
		else if (strcmp(token, "nvrm-unk-0-fields") == 0)
			_filter_nvrm_show_unk_zero_fields(en);
		else if (strncmp(token, "nvrm-ioctl=", 11) == 0)
		{
			if (strcmp(token + 11, "all") == 0)
				_filter_all_nvrm_ioctls(en);
			else
				_filter_nvrm_ioctl(token + 11, en);
			if (en)
				_filter_ioctl_desc(en);
		}
		else if (strcmp(token, "nvrm-obj-tree") == 0)
			_filter_dump_object_tree_on_create_destroy(en);
		else if (strcmp(token, "nvrm") == 0)
		{
			if (en)
				_filter_ioctl_desc(en);
			_filter_all_nvrm_ioctls(en);
			_filter_all_nvrm_mthds(en);
			_filter_nvrm_describe_handles(en);
			_filter_nvrm_describe_classes(en);
			_filter_dump_object_tree_on_create_destroy(en);
		}
		else if (strcmp(token, "info") == 0)
			_filter_info(en);
		else if (strcmp(token, "all") == 0)
		{
			_filter_info(en);
			_filter_write(en);
			_filter_read(en);
			_filter_gpu_addr(en);
			_filter_ioctl_raw(en);
			_filter_ioctl_desc(en);
			_filter_tsc(en);
			_filter_tic(en);
			_filter_vp(en);
			_filter_fp(en);
			_filter_gp(en);
			_filter_cp(en);
			_filter_tep(en);
			_filter_tcp(en);
			_filter_macro_rt_verbose(en);
			_filter_macro_rt(en);
			_filter_macro_dis_enabled(en);
			_filter_buffer_usage(en);
			_filter_all_classes(en);
			_filter_decode_pb(en);
			_filter_sys_mmap(en);
			_filter_sys_mmap_details(en);
			_filter_sys_munmap(en);
			_filter_sys_mremap(en);
			_filter_sys_open(en);
			_filter_msg(en);
			_filter_sys_write(en);
			_filter_nvrm_describe_handles(en);
			_filter_nvrm_describe_classes(en);
			_filter_all_nvrm_mthds(en);
			_filter_nvrm_show_unk_zero_fields(en);
			_filter_all_nvrm_ioctls(en);
			_filter_dump_object_tree_on_create_destroy(en);
		}
		else
		{
			fprintf(stderr, "unknown token: %s\n", token);
			fflush(stderr);
			exit(1);
		}
	}

	free(arg);
}